

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

bool __thiscall
QFSFileEnginePrivate::nativeOpenImpl(QFSFileEnginePrivate *this,OpenMode openMode,mode_t mode)

{
  QAbstractFileEngine *this_00;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *__file;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QLatin1StringView local_68;
  QArrayDataPointer<char16_t> local_58;
  undefined4 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x20) == 0) {
LAB_00125553:
    this->closeFileHandle = true;
    bVar2 = true;
  }
  else {
    this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
    uVar3 = 2;
    if ((~(uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 3) != 0) {
      uVar3 = (uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                    super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i >> 1 & 1;
    }
    uVar1 = uVar3 + 0x40;
    if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x82) != 2) {
      uVar1 = uVar3;
    }
    do {
      QFileSystemEntry::nativeFilePath((NativePath *)&local_58,&this->fileEntry);
      __file = (char *)local_58.ptr;
      if (local_58.ptr == (char16_t *)0x0) {
        __file = "";
      }
      do {
        iVar4 = open64(__file,uVar1 + (((uint)openMode.
                                              super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                              .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i &
                                       4) << 8 |
                                      ((uint)openMode.
                                             super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                             .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 8
                                      ) << 6) + ((uint)openMode.
                                                  super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                                  .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.
                                                  i & 0x40) * 2 + 0x80000,(ulong)mode);
        if (iVar4 != -1) break;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      this->fd = iVar4;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      if (this->fd != -1) {
        if (((((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                     super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 2) != 0) ||
            (bVar2 = QFileSystemEngine::fillMetaData(this->fd,&this->metaData), !bVar2)) ||
           (((this->metaData).entryFlags.
             super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x40000) == 0)) {
          this->fh = (FILE *)0x0;
          goto LAB_00125553;
        }
        local_58.d = (Data *)0x206f7420656c6966;
        local_58.ptr = (char16_t *)0x207369206e65706f;
        local_58.size = 0x7463657269642061;
        local_40 = 0x79726f;
        QLatin1StringView::QLatin1StringView(&local_68,(char *)&local_58);
        QString::QString((QString *)&local_80,local_68);
        QAbstractFileEngine::setError(this_00,OpenError,(QString *)&local_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        iVar4 = this->fd;
        goto LAB_001255e2;
      }
      piVar6 = __errno_location();
      iVar4 = *piVar6;
    } while (iVar4 == 4);
    qt_error_string((QString *)&local_58,iVar4);
    QAbstractFileEngine::setError(this_00,iVar4 == 0x18 ^ OpenError,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_0012552d:
    bVar2 = false;
  }
LAB_0012555c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
  while( true ) {
    piVar6 = __errno_location();
    bVar2 = false;
    if (*piVar6 != 4) break;
LAB_001255e2:
    iVar5 = close(iVar4);
    if (iVar5 != -1) goto LAB_0012552d;
  }
  goto LAB_0012555c;
}

Assistant:

bool QFSFileEnginePrivate::nativeOpenImpl(QIODevice::OpenMode openMode, mode_t mode)
{
    Q_Q(QFSFileEngine);

    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");
    if (openMode & QIODevice::Unbuffered) {
        int flags = openModeToOpenFlags(openMode);

        // Try to open the file in unbuffered mode.
        do {
            fd = QT_OPEN(fileEntry.nativeFilePath().constData(), flags, mode);
        } while (fd == -1 && errno == EINTR);

        // On failure, return and report the error.
        if (fd == -1) {
            q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                        qt_error_string(errno));
            return false;
        }

        if (!(openMode & QIODevice::WriteOnly)) {
            // we don't need this check if we tried to open for writing because then
            // we had received EISDIR anyway.
            if (QFileSystemEngine::fillMetaData(fd, metaData)
                    && metaData.isDirectory()) {
                q->setError(QFile::OpenError, msgOpenDirectory());
                QT_CLOSE(fd);
                return false;
            }
        }

        // Seek to the end when in Append mode.
        if (flags & QFile::Append) {
            QT_OFF_T ret;
            do {
                ret = QT_LSEEK(fd, 0, SEEK_END);
            } while (ret == -1 && errno == EINTR);

            if (ret == -1) {
                q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                            qt_error_string(errno));
                return false;
            }
        }

        fh = nullptr;
    }

    closeFileHandle = true;
    return true;
}